

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprintpreviewdialog.cpp
# Opt level: O0

void QPrintPreviewDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPrintPreviewDialogPrivate *this;
  QMetaType QVar1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QPrintPreviewDialog *_t;
  QPrinter *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QPrintPreviewDialogPrivate *in_stack_ffffffffffffff90;
  QMetaType local_38;
  QMetaTypeInterface *local_30;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    this = (QPrintPreviewDialogPrivate *)(ulong)in_EDX;
    switch(this) {
    case (QPrintPreviewDialogPrivate *)0x0:
      paintRequested((QPrintPreviewDialog *)0x17f362,in_stack_ffffffffffffff78);
      break;
    case (QPrintPreviewDialogPrivate *)0x1:
      d_func((QPrintPreviewDialog *)0x17f371);
      QPrintPreviewDialogPrivate::_q_fit
                ((QPrintPreviewDialogPrivate *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (QAction *)in_stack_ffffffffffffff78);
      break;
    case (QPrintPreviewDialogPrivate *)0x2:
      d_func((QPrintPreviewDialog *)0x17f394);
      QPrintPreviewDialogPrivate::_q_zoomIn
                ((QPrintPreviewDialogPrivate *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      break;
    case (QPrintPreviewDialogPrivate *)0x3:
      d_func((QPrintPreviewDialog *)0x17f3ab);
      QPrintPreviewDialogPrivate::_q_zoomOut
                ((QPrintPreviewDialogPrivate *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      break;
    case (QPrintPreviewDialogPrivate *)0x4:
      d_func((QPrintPreviewDialog *)0x17f3c2);
      QPrintPreviewDialogPrivate::_q_navigate(in_stack_ffffffffffffff90,(QAction *)this);
      break;
    case (QPrintPreviewDialogPrivate *)0x5:
      d_func((QPrintPreviewDialog *)0x17f3e5);
      QPrintPreviewDialogPrivate::_q_setMode
                ((QPrintPreviewDialogPrivate *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (QAction *)in_stack_ffffffffffffff78);
      break;
    case (QPrintPreviewDialogPrivate *)0x6:
      d_func((QPrintPreviewDialog *)0x17f405);
      QPrintPreviewDialogPrivate::_q_pageNumEdited(this);
      break;
    case (QPrintPreviewDialogPrivate *)0x7:
      d_func((QPrintPreviewDialog *)0x17f419);
      QPrintPreviewDialogPrivate::_q_print(in_stack_ffffffffffffff90);
      break;
    case (QPrintPreviewDialogPrivate *)0x8:
      d_func((QPrintPreviewDialog *)0x17f42d);
      QPrintPreviewDialogPrivate::_q_pageSetup(in_stack_ffffffffffffff90);
      break;
    case (QPrintPreviewDialogPrivate *)0x9:
      d_func((QPrintPreviewDialog *)0x17f441);
      QPrintPreviewDialogPrivate::_q_previewChanged
                ((QPrintPreviewDialogPrivate *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      break;
    case (QPrintPreviewDialogPrivate *)0xa:
      d_func((QPrintPreviewDialog *)0x17f455);
      QPrintPreviewDialogPrivate::_q_zoomFactorChanged
                ((QPrintPreviewDialogPrivate *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 1) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else if (in_EDX == 4) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_30 = (QMetaTypeInterface *)QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX = local_30;
      }
      else {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        **(undefined8 **)in_RCX = local_28.d_ptr;
      }
    }
    else if (in_EDX == 5) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar1 = QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX = QVar1.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)in_RCX = local_38.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QPrintPreviewDialog::*)(QPrinter*)>
              (in_RCX,(void **)paintRequested,0,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrintPreviewDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPrintPreviewDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->paintRequested((*reinterpret_cast< std::add_pointer_t<QPrinter*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_fit((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 2: _t->d_func()->_q_zoomIn(); break;
        case 3: _t->d_func()->_q_zoomOut(); break;
        case 4: _t->d_func()->_q_navigate((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 5: _t->d_func()->_q_setMode((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 6: _t->d_func()->_q_pageNumEdited(); break;
        case 7: _t->d_func()->_q_print(); break;
        case 8: _t->d_func()->_q_pageSetup(); break;
        case 9: _t->d_func()->_q_previewChanged(); break;
        case 10: _t->d_func()->_q_zoomFactorChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPrintPreviewDialog::*)(QPrinter * )>(_a, &QPrintPreviewDialog::paintRequested, 0))
            return;
    }
}